

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_name.c
# Opt level: O0

char * p2sc_name_swap_tmr(char *dir,guint8 *data,size_t len,guint64 o)

{
  guint32 gVar1;
  char *pcVar2;
  undefined8 in_RCX;
  size_t in_RDX;
  guint8 *in_RSI;
  char *in_RDI;
  char acrc [9];
  guint32 crc;
  size_t in_stack_ffffffffffffffc8;
  char local_2d;
  guint32 in_stack_ffffffffffffffd4;
  
  p2sc_crc32(0,in_RSI,in_RDX);
  gVar1 = p2sc_crc32_finalise(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8);
  sprintf(&local_2d,"%08x",(ulong)gVar1);
  if (in_RDI == (char *)0x0) {
    in_RDI = ".";
  }
  pcVar2 = (char *)g_strdup_printf("%s/swap_%014lu_%s.fits",in_RDI,in_RCX,&local_2d);
  return pcVar2;
}

Assistant:

char *p2sc_name_swap_tmr(const char *dir, const guint8 *data, size_t len, guint64 o) {
    guint32 crc = p2sc_crc32_finalise(p2sc_crc32(0, data, len), len);
    char acrc[2 * sizeof crc + 1];

    sprintf(acrc, "%08x", crc);
    return g_strdup_printf("%s" DS "swap_" P_OBET_F "_%s.fits", DN(dir), o, acrc);
}